

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1_util.cpp
# Opt level: O3

secp256k1_xonly_pubkey *
cfd::core::GetXOnlyPubkeyFromPubkey
          (secp256k1_xonly_pubkey *__return_storage_ptr__,secp256k1_pubkey *pubkey,bool *parity)

{
  int iVar1;
  secp256k1_context_struct *ctx;
  CfdException *this;
  int pk_parity;
  int local_44;
  string local_40;
  
  ctx = wally_get_secp_context();
  local_44 = 0;
  iVar1 = secp256k1_xonly_pubkey_from_pubkey(ctx,__return_storage_ptr__,&local_44,pubkey);
  if (iVar1 == 1) {
    if (parity != (bool *)0x0) {
      *parity = local_44 != 0;
    }
    return __return_storage_ptr__;
  }
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Could not get xonly pubkey from pubkey","");
  CfdException::CfdException(this,kCfdInternalError,&local_40);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

secp256k1_xonly_pubkey GetXOnlyPubkeyFromPubkey(
    const secp256k1_pubkey& pubkey, bool* parity) {
  auto ctx = wally_get_secp_context();
  secp256k1_xonly_pubkey xonly_pubkey;
  int pk_parity = 0;

  auto ret = secp256k1_xonly_pubkey_from_pubkey(
      ctx, &xonly_pubkey, &pk_parity, &pubkey);
  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not get xonly pubkey from pubkey");
  }
  if (parity != nullptr) *parity = (pk_parity != 0);

  return xonly_pubkey;
}